

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

_Bool cf_he_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  long lVar2;
  long *plVar3;
  byte bVar4;
  _Bool _Var5;
  long lVar6;
  
  if ((cf->field_0x24 & 1) != 0) {
    _Var5 = (*cf->next->cft->has_data_pending)(cf->next,data);
    return _Var5;
  }
  pvVar1 = cf->ctx;
  lVar6 = 0;
  while( true ) {
    lVar2 = *(long *)((long)pvVar1 + lVar6 * 8 + 0x20);
    bVar4 = 0;
    if ((lVar2 != 0) && (plVar3 = *(long **)(lVar2 + 0x28), plVar3 != (long *)0x0)) {
      bVar4 = (**(code **)(*plVar3 + 0x40))(plVar3,data);
    }
    if ((bVar4 & 3) != 0) break;
    lVar6 = lVar6 + 1;
    if (lVar6 != 1) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool cf_he_data_pending(struct Curl_cfilter *cf,
                               const struct Curl_easy *data)
{
  struct cf_he_ctx *ctx = cf->ctx;
  size_t i;

  if(cf->connected)
    return cf->next->cft->has_data_pending(cf->next, data);

  for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
    struct eyeballer *baller = ctx->baller[i];
    if(!baller || !baller->cf)
      continue;
    if(baller->cf->cft->has_data_pending(baller->cf, data))
      return TRUE;
  }
  return FALSE;
}